

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmframe.cpp
# Opt level: O1

void __thiscall VMScriptFunction::~VMScriptFunction(VMScriptFunction *this)

{
  long lVar1;
  ulong uVar2;
  
  (this->super_VMFunction).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0086b368;
  if (this->Code != (VMOP *)0x0) {
    if ((this->KonstS != (FString *)0x0) && (this->NumKonstS != '\0')) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        FString::~FString((FString *)((long)&this->KonstS->Chars + lVar1));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 8;
      } while (uVar2 < this->NumKonstS);
    }
    M_Free(this->Code);
  }
  DObject::~DObject((DObject *)this);
  return;
}

Assistant:

VMScriptFunction::~VMScriptFunction()
{
	if (Code != NULL)
	{
		if (KonstS != NULL)
		{
			for (int i = 0; i < NumKonstS; ++i)
			{
				KonstS[i].~FString();
			}
		}
		M_Free(Code);
	}
}